

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-terrain.cpp
# Opt level: O1

bool loadPrograms(void)

{
  bool bVar1;
  
  bVar1 = loadViewerProgram();
  if (bVar1) {
    bVar1 = loadTerrainProgram();
  }
  if (bVar1 != false) {
    bVar1 = loadSubdCsLodProgram();
  }
  if (bVar1 != false) {
    bVar1 = loadUpdateIndirectPrograms();
    return bVar1;
  }
  return false;
}

Assistant:

bool loadPrograms()
{
    bool v = true;

    if (v) v &= loadViewerProgram();
    if (v) v &= loadTerrainProgram();
    if (v) v &= loadSubdCsLodProgram();
    if (v) v &= loadUpdateIndirectPrograms();

    return v;
}